

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O1

ssize_t __thiscall
Liby::Connection::send(Connection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Channel *this_00;
  undefined8 this_01;
  _Head_base<0UL,_std::function<void_()>_*,_false> __ptr;
  __uniq_ptr_data<std::function<void_()>,_std::default_delete<std::function<void_()>_>,_true,_true>
  this_02;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t extraout_RAX_02;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  pointer __p;
  bool bVar2;
  io_task task;
  undefined1 local_69;
  Buffer *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  undefined1 local_58 [48];
  _Head_base<0UL,_std::function<void_()>_*,_false> local_28;
  
  local_58._32_8_ = (element_type *)0x0;
  local_58._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  local_58._0_8_ = (element_type *)0x0;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28._M_head_impl = (function<void_()> *)0x0;
  local_68 = (Buffer *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Liby::Buffer,std::allocator<Liby::Buffer>,Liby::Buffer>
            (&_Stack_60,&local_68,(allocator<Liby::Buffer> *)&local_69,
             (Buffer *)CONCAT44(in_register_00000034,__fd));
  this_01 = local_58._40_8_;
  local_58._40_8_ = _Stack_60._M_pi;
  local_58._32_8_ = local_68;
  local_68 = (Buffer *)0x0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
  }
  if (*(long *)((long)__buf + 0x10) != 0) {
    this_02.
    super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>.
    _M_t.
    super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>.
    super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl =
         (__uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>)
         operator_new(0x20);
    std::function<void_()>::function
              ((function<void_()> *)
               this_02.
               super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
               .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl,
               (function<void_()> *)__buf);
    __ptr._M_head_impl = local_28._M_head_impl;
    local_68 = (Buffer *)0x0;
    bVar2 = (tuple<std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>)
            local_28._M_head_impl != (_Head_base<0UL,_std::function<void_()>_*,_false>)0x0;
    local_28._M_head_impl =
         (function<void_()> *)
         this_02.
         super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
         .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl;
    if (bVar2) {
      std::default_delete<std::function<void_()>_>::operator()
                ((default_delete<std::function<void_()>_> *)&local_28,__ptr._M_head_impl);
    }
    if (local_68 != (Buffer *)0x0) {
      std::default_delete<std::function<void_()>_>::operator()
                ((default_delete<std::function<void_()>_> *)&local_68,(function<void_()> *)local_68)
      ;
    }
  }
  std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::emplace_back<Liby::io_task>
            (&this->writTasks_,(io_task *)local_58);
  this_00 = (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00->writable_ = true;
  Channel::updateChannel(this_00);
  sVar1 = extraout_RAX;
  if ((_Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>)
      local_28._M_head_impl != (function<void_()> *)0x0) {
    std::default_delete<std::function<void_()>_>::operator()
              ((default_delete<std::function<void_()>_> *)&local_28,local_28._M_head_impl);
    sVar1 = extraout_RAX_00;
  }
  local_28._M_head_impl = (function<void_()> *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._40_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._40_8_);
    sVar1 = extraout_RAX_01;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    sVar1 = extraout_RAX_02;
  }
  return sVar1;
}

Assistant:

void Connection::send(Buffer &&buf, const BasicHandler &handler) {
    io_task task;
    task.buffer_ = std::make_shared<Buffer>(std::move(buf));
    if (handler) {
        task.handler_ = std::make_unique<BasicHandler>(handler);
    }
    writTasks_.emplace_back(std::move(task));
    enableWrit();
}